

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  Prog prog;
  Theme theme;
  ALLEGRO_MIXER *mixer;
  ALLEGRO_CHANNEL_CONF ch;
  ALLEGRO_AUDIO_DEPTH depth;
  uint freq;
  uint samples;
  size_t buffers;
  ALLEGRO_DISPLAY *display;
  Prog *this;
  Prog *in_stack_ffffffffffffec90;
  ALLEGRO_FONT *in_stack_ffffffffffffec98;
  Theme *in_stack_ffffffffffffeca0;
  Theme *in_stack_ffffffffffffeca8;
  Prog *in_stack_ffffffffffffecb0;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  al_install_keyboard();
  al_install_mouse();
  al_init_primitives_addon();
  al_init_font_addon();
  al_init_ttf_addon();
  init_platform_specific();
  al_set_new_display_flags(0x40);
  lVar2 = al_create_display(800,600);
  if (lVar2 == 0) {
    abort_example("Unable to create display\n");
  }
  al_set_window_title(lVar2,"Synthesiser of sorts");
  font_gui = (ALLEGRO_FONT *)al_load_ttf_font("data/DejaVuSans.ttf",0xc,0);
  if (font_gui == (ALLEGRO_FONT *)0x0) {
    abort_example("Failed to load font\n");
  }
  uVar1 = al_install_audio();
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init sound!\n");
  }
  uVar1 = al_reserve_samples(0);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not set up voice and mixer.\n");
  }
  stream1 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
  stream2 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
  stream3 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
  stream4 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
  stream5 = (ALLEGRO_AUDIO_STREAM *)al_create_audio_stream(8,0x400,0xac44,3,0x10);
  if ((((stream1 == (ALLEGRO_AUDIO_STREAM *)0x0) || (stream2 == (ALLEGRO_AUDIO_STREAM *)0x0)) ||
      (stream3 == (ALLEGRO_AUDIO_STREAM *)0x0)) ||
     ((stream4 == (ALLEGRO_AUDIO_STREAM *)0x0 || (stream5 == (ALLEGRO_AUDIO_STREAM *)0x0)))) {
    abort_example("Could not create stream.\n");
  }
  uVar3 = al_get_default_mixer();
  uVar1 = al_attach_audio_stream_to_mixer(stream1,uVar3);
  if ((((uVar1 & 1) == 0) ||
      (uVar1 = al_attach_audio_stream_to_mixer(stream2,uVar3), (uVar1 & 1) == 0)) ||
     ((uVar1 = al_attach_audio_stream_to_mixer(stream3,uVar3), (uVar1 & 1) == 0 ||
      ((uVar1 = al_attach_audio_stream_to_mixer(stream4,uVar3), (uVar1 & 1) == 0 ||
       (uVar1 = al_attach_audio_stream_to_mixer(stream5,uVar3), (uVar1 & 1) == 0)))))) {
    abort_example("Could not attach stream to mixer.\n");
  }
  al_set_mixer_postprocess_callback(uVar3,mixer_pp_callback);
  Theme::Theme(in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98);
  this = (Prog *)&stack0xffffffffffffec78;
  Prog::Prog(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
             (ALLEGRO_DISPLAY *)in_stack_ffffffffffffeca0);
  Prog::run(in_stack_ffffffffffffec90);
  Prog::~Prog(this);
  al_destroy_audio_stream(stream1);
  al_destroy_audio_stream(stream2);
  al_destroy_audio_stream(stream3);
  al_destroy_audio_stream(stream4);
  al_destroy_audio_stream(stream5);
  al_uninstall_audio();
  al_destroy_font(font_gui);
  al_fclose();
  close_log(false);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   al_install_keyboard();
   al_install_mouse();

   al_init_primitives_addon();
   al_init_font_addon();
   al_init_ttf_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Unable to create display\n");
   }
   al_set_window_title(display, "Synthesiser of sorts");

   font_gui = al_load_ttf_font("data/DejaVuSans.ttf", 12, 0);
   if (!font_gui) {
      abort_example("Failed to load font\n");
   }

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(0)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   size_t buffers = 8;
   unsigned samples = SAMPLES_PER_BUFFER;
   unsigned freq = STREAM_FREQUENCY;
   ALLEGRO_AUDIO_DEPTH depth = ALLEGRO_AUDIO_DEPTH_FLOAT32;
   ALLEGRO_CHANNEL_CONF ch = ALLEGRO_CHANNEL_CONF_1;

   stream1 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream2 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream3 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream4 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   stream5 = al_create_audio_stream(buffers, samples, freq, depth, ch);
   if (!stream1 || !stream2 || !stream3 || !stream4 || !stream5) {
      abort_example("Could not create stream.\n");
   }

   ALLEGRO_MIXER *mixer = al_get_default_mixer();
   if (
      !al_attach_audio_stream_to_mixer(stream1, mixer) ||
      !al_attach_audio_stream_to_mixer(stream2, mixer) ||
      !al_attach_audio_stream_to_mixer(stream3, mixer) ||
      !al_attach_audio_stream_to_mixer(stream4, mixer) ||
      !al_attach_audio_stream_to_mixer(stream5, mixer)
   ) {
      abort_example("Could not attach stream to mixer.\n");
   }

   al_set_mixer_postprocess_callback(mixer, mixer_pp_callback, mixer);

   /* Prog is destroyed at the end of this scope. */
   {
      Theme theme(font_gui);
      Prog prog(theme, display);
      prog.run();
   }

   al_destroy_audio_stream(stream1);
   al_destroy_audio_stream(stream2);
   al_destroy_audio_stream(stream3);
   al_destroy_audio_stream(stream4);
   al_destroy_audio_stream(stream5);
   al_uninstall_audio();

   al_destroy_font(font_gui);

   al_fclose(save_fp);

   close_log(false);

   return 0;
}